

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamerTests.cpp
# Opt level: O3

void __thiscall TestNameResetter::~TestNameResetter(TestNameResetter *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  std::__cxx11::string::_M_assign((string *)&ApprovalTests::TestName::directoryPrefix_abi_cxx11_);
  pcVar1 = (this->oldPrefix_)._M_dataplus._M_p;
  paVar2 = &(this->oldPrefix_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~TestNameResetter()
    {
        TestName::directoryPrefix = oldPrefix_;
    }